

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

SUNErrCode SUNQRAdd_MGS(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  long lVar1;
  long lVar2;
  long lVar3;
  sunrealtype sVar4;
  double dVar5;
  
  N_VScale(1.0,df,*QRdata);
  lVar2 = (long)m;
  lVar3 = 0;
  lVar1 = 0;
  if (0 < lVar2) {
    lVar1 = lVar2;
  }
  for (; lVar1 != lVar3; lVar3 = lVar3 + 1) {
    sVar4 = N_VDotProd(Q[lVar3],*QRdata);
    R[m * mMax + lVar3] = sVar4;
    N_VLinearSum(1.0,*QRdata,-sVar4,Q[lVar3],*QRdata);
  }
  sVar4 = N_VDotProd(*QRdata,*QRdata);
  dVar5 = 0.0;
  if (0.0 < sVar4) {
    if (sVar4 < 0.0) {
      dVar5 = sqrt(sVar4);
    }
    else {
      dVar5 = SQRT(sVar4);
    }
  }
  R[m * (mMax + 1)] = dVar5;
  N_VScale(1.0 / dVar5,*QRdata,Q[lVar2]);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_MGS(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                        int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);

  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr();
  for (j = 0; j < m; j++)
  {
    R[m * mMax + j] = N_VDotProd(Q[j], qrdata->vtemp);
    SUNCheckLastErr();
    N_VLinearSum(ONE, qrdata->vtemp, -R[m * mMax + j], Q[j], qrdata->vtemp);
    SUNCheckLastErr();
  }
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}